

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

span<unsigned_long,_18446744073709551615UL> __thiscall
Disa::Adjacency_Graph<true>::front(Adjacency_Graph<true> *this)

{
  bool bVar1;
  ostream *poVar2;
  source_location *in_RCX;
  span<unsigned_long,_18446744073709551615UL> sVar3;
  size_t local_60 [3];
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Adjacency_Graph<true> *local_20;
  Adjacency_Graph<true> *this_local;
  
  local_20 = this;
  bVar1 = empty(this);
  if (!bVar1) {
    local_60[0] = 0;
    sVar3 = operator[](this,local_60);
    return sVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_001dc138;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"Graph is empty, cannot get the front.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

[[nodiscard]] inline std::span<std::size_t> front() {
    ASSERT_DEBUG(!empty(), "Graph is empty, cannot get the front.");
    return (*this)[0];
  }